

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O0

djg_mesh * djgm_load_torus(float aspect,int ring_segments,int pipe_segments)

{
  float fVar1;
  float fVar2;
  djg_mesh *pdVar3;
  djgm_vertex *pdVar4;
  float fVar5;
  double dVar6;
  float tmp;
  float a2;
  float a1;
  djgm_vertex *v;
  int j;
  int i;
  djg_mesh *mesh;
  int pipe_segments_local;
  int ring_segments_local;
  float aspect_local;
  
  pdVar3 = djgm_load_plane(ring_segments,pipe_segments);
  for (v._4_4_ = 0; v._4_4_ < ring_segments + 2; v._4_4_ = v._4_4_ + 1) {
    for (v._0_4_ = 0; (int)v < pipe_segments + 2; v._0_4_ = (int)v + 1) {
      pdVar4 = pdVar3->vertexv + (v._4_4_ * (pipe_segments + 2) + (int)v);
      fVar1 = (pdVar4->st).s * 2.0 * 3.1415927;
      fVar2 = (pdVar4->st).t * 2.0 * 3.1415927;
      dVar6 = std::cos((double)(ulong)(uint)fVar1);
      fVar5 = aspect * SUB84(dVar6,0) + 1.0;
      dVar6 = std::cos((double)(ulong)(uint)fVar2);
      (pdVar4->p).x = fVar5 * SUB84(dVar6,0);
      dVar6 = std::sin((double)(ulong)(uint)fVar2);
      (pdVar4->p).y = fVar5 * SUB84(dVar6,0);
      dVar6 = std::sin((double)(ulong)(uint)fVar1);
      (pdVar4->p).z = aspect * SUB84(dVar6,0);
      (pdVar4->dpds).x = 0.0;
      (pdVar4->dpds).y = 0.0;
      (pdVar4->dpds).z = 0.0;
      (pdVar4->dpdt).x = 0.0;
      (pdVar4->dpdt).y = 0.0;
      (pdVar4->dpdt).z = 1.0;
    }
  }
  return pdVar3;
}

Assistant:

DJGDEF djg_mesh *
djgm_load_torus(
    float aspect, int ring_segments, int pipe_segments
) {
    djg_mesh *mesh = djgm_load_plane(ring_segments, pipe_segments);
    int i, j;

    ring_segments+= 2;
    pipe_segments+= 2;

    for (i = 0; i < ring_segments; ++i)
    for (j = 0; j < pipe_segments; ++j) {
        djgm_vertex *v = &mesh->vertexv[i * pipe_segments + j];
        float a1 = v->st.s * 2 * M_PI;
        float a2 = v->st.t * 2 * M_PI;
        float tmp = 1 + aspect * cos(a1);

        v->p.x = tmp * cos(a2);
        v->p.y = tmp * sin(a2);
        v->p.z = aspect * sin(a1);

        // tangent (requires normalization)
        v->dpds.x = 0;
        v->dpds.y = 0;
        v->dpds.z = 0;

        // bitangent
        v->dpdt.x = 0;
        v->dpdt.y = 0;
        v->dpdt.z = 1;
    }

    return mesh;
}